

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_kernel.h
# Opt level: O1

void __thiscall
dlib::
array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
::set_size(array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
           *this,size_t size)

{
  uint *puVar1;
  task_state_type *ptVar2;
  ostream *poVar3;
  fatal_error *this_00;
  ostringstream dlib_o_out;
  string sStack_1b8;
  long local_198 [3];
  uint auStack_180 [88];
  
  if (size <= this->max_array_size) {
    (*(this->super_enumerable<dlib::thread_pool_implementation::task_state_type>)._vptr_enumerable
      [3])(this);
    this->array_size = size;
    ptVar2 = this->array_elements + (size - 1);
    if (size == 0) {
      ptVar2 = (task_state_type *)0x0;
    }
    this->last_pos = ptVar2;
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"\n\nError detected at line ",0x19);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_198,0x187);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Error detected in file ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/threads/../array/array_kernel.h"
             ,0x85);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Error detected in function ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "void dlib::array<dlib::thread_pool_implementation::task_state_type>::set_size(size_t) [T = dlib::thread_pool_implementation::task_state_type, mem_manager = dlib::memory_manager_stateless_kernel_1<char>]"
             ,0xca);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,".\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Failing expression was ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"( size <= this->max_size() )",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,".\n",2);
  puVar1 = (uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"\tvoid array::set_size",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"\n\tsize must be <= max_size()",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n\tsize: ",8);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n\tmax size: ",0xc);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n\tthis: ",8);
  poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  this_00 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this_00,EBROKEN_ASSERT,&sStack_1b8);
  __cxa_throw(this_00,&fatal_error::typeinfo,error::~error);
}

Assistant:

void array<T,mem_manager>::
    set_size (
        size_t size
    )
    {
        // make sure requires clause is not broken
        DLIB_CASSERT(( size <= this->max_size() ),
            "\tvoid array::set_size"
            << "\n\tsize must be <= max_size()"
            << "\n\tsize: " << size 
            << "\n\tmax size: " << this->max_size()
            << "\n\tthis: " << this
            );

        reset();
        array_size = size;
        if (size > 0)
            last_pos = array_elements + size - 1;
        else
            last_pos = 0;
    }